

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
::find_or_prepare_insert_non_soo<google::protobuf::Descriptor_const*>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
          *this,Descriptor **key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  char cVar7;
  long lVar8;
  uint uVar9;
  uint64_t v;
  ctrl_t *pcVar10;
  ushort uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i match;
  FindInfo FVar23;
  ulong local_70;
  anon_union_8_1_a8a14541_for_iterator_2 local_68;
  char cVar20;
  char cVar21;
  char cVar22;
  
  uVar2 = *(ulong *)(this + 0x10);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)*key;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = &(*key)->super_SymbolBase +
                 (SUB168(auVar17 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar17 * ZEXT816(0x9ddfea08eb382d69),8));
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar16 = SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar15 = (uVar16 >> 7 ^ uVar2 >> 0xc) & uVar3;
  auVar17 = ZEXT216(CONCAT11((char)uVar16,(char)uVar16) & 0x7f7f);
  auVar17 = pshuflw(auVar17,auVar17,0);
  pcVar10 = (__return_storage_ptr__->first).ctrl_;
  local_68 = (__return_storage_ptr__->first).field_1;
  bVar14 = __return_storage_ptr__->second;
  local_70 = 0;
  do {
    pcVar1 = (char *)(uVar2 + uVar15);
    cVar7 = auVar17[0];
    auVar19[0] = -(cVar7 == *pcVar1);
    cVar20 = auVar17[1];
    auVar19[1] = -(cVar20 == pcVar1[1]);
    cVar21 = auVar17[2];
    auVar19[2] = -(cVar21 == pcVar1[2]);
    cVar22 = auVar17[3];
    auVar19[3] = -(cVar22 == pcVar1[3]);
    auVar19[4] = -(cVar7 == pcVar1[4]);
    auVar19[5] = -(cVar20 == pcVar1[5]);
    auVar19[6] = -(cVar21 == pcVar1[6]);
    auVar19[7] = -(cVar22 == pcVar1[7]);
    auVar19[8] = -(cVar7 == pcVar1[8]);
    auVar19[9] = -(cVar20 == pcVar1[9]);
    auVar19[10] = -(cVar21 == pcVar1[10]);
    auVar19[0xb] = -(cVar22 == pcVar1[0xb]);
    auVar19[0xc] = -(cVar7 == pcVar1[0xc]);
    auVar19[0xd] = -(cVar20 == pcVar1[0xd]);
    auVar19[0xe] = -(cVar21 == pcVar1[0xe]);
    auVar19[0xf] = -(cVar22 == pcVar1[0xf]);
    uVar11 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    uVar9 = (uint)uVar11;
    if (uVar11 != 0) {
      lVar8 = *(long *)(this + 0x18);
      do {
        uVar4 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar12 = uVar4 + uVar15 & uVar3;
        lVar13 = uVar12 * 0x20;
        if (*(Descriptor **)(lVar8 + lVar13) == *key) {
          (__return_storage_ptr__->first).field_1 = local_68;
          __return_storage_ptr__->second = bVar14;
          (__return_storage_ptr__->first).ctrl_ = pcVar10;
          if (*(long *)(this + 0x10) != 0) {
            (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar12);
            (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar8 + lVar13);
            __return_storage_ptr__->second = false;
            return __return_storage_ptr__;
          }
          goto LAB_00222a40;
        }
        uVar11 = (ushort)(uVar9 - 1) & (ushort)uVar9;
        uVar9 = CONCAT22((short)(uVar9 - 1 >> 0x10),uVar11);
      } while (uVar11 != 0);
    }
    auVar18[0] = -(*pcVar1 == -0x80);
    auVar18[1] = -(pcVar1[1] == -0x80);
    auVar18[2] = -(pcVar1[2] == -0x80);
    auVar18[3] = -(pcVar1[3] == -0x80);
    auVar18[4] = -(pcVar1[4] == -0x80);
    auVar18[5] = -(pcVar1[5] == -0x80);
    auVar18[6] = -(pcVar1[6] == -0x80);
    auVar18[7] = -(pcVar1[7] == -0x80);
    auVar18[8] = -(pcVar1[8] == -0x80);
    auVar18[9] = -(pcVar1[9] == -0x80);
    auVar18[10] = -(pcVar1[10] == -0x80);
    auVar18[0xb] = -(pcVar1[0xb] == -0x80);
    auVar18[0xc] = -(pcVar1[0xc] == -0x80);
    auVar18[0xd] = -(pcVar1[0xd] == -0x80);
    auVar18[0xe] = -(pcVar1[0xe] == -0x80);
    auVar18[0xf] = -(pcVar1[0xf] == -0x80);
    uVar11 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
    if (uVar11 == 0) {
      if (*(ulong *)this < local_70 + 0x10) {
        (__return_storage_ptr__->first).field_1 = local_68;
        __return_storage_ptr__->second = bVar14;
        (__return_storage_ptr__->first).ctrl_ = pcVar10;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::DescriptorBuilder::MessageHints>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::DescriptorBuilder::MessageHints>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::DescriptorBuilder::MessageHints>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::DescriptorBuilder::MessageHints>>, K = const google::protobuf::Descriptor *]"
                     );
      }
      uVar15 = uVar15 + local_70 + 0x10 & uVar3;
      local_70 = local_70 + 0x10;
    }
    else {
      cVar7 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (*(ulong *)this,uVar16,*(ctrl_t **)(this + 0x10));
      if (cVar7 == '\0') {
        uVar9 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
      }
      else {
        uVar5 = 0xf;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar9 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
      }
      FVar23.offset = uVar9 + uVar15 & uVar3;
      FVar23.probe_length = local_70;
      lVar8 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                        ((CommonFields *)this,uVar16,FVar23,
                         (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = local_68;
        __return_storage_ptr__->second = bVar14;
        (__return_storage_ptr__->first).ctrl_ = pcVar10;
LAB_00222a40:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::DescriptorBuilder::MessageHints>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::DescriptorBuilder::MessageHints>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, google::protobuf::DescriptorBuilder::MessageHints>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, google::protobuf::DescriptorBuilder::MessageHints>>]"
                     );
      }
      pcVar10 = (ctrl_t *)(*(long *)(this + 0x10) + lVar8);
      local_68.slot_ = (slot_type *)(lVar8 * 0x20 + *(long *)(this + 0x18));
      bVar14 = true;
    }
    if (uVar11 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)local_68;
      __return_storage_ptr__->second = bVar14;
      (__return_storage_ptr__->first).ctrl_ = pcVar10;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }